

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::HashAggregateGroupingLocalState::HashAggregateGroupingLocalState
          (HashAggregateGroupingLocalState *this,PhysicalHashAggregate *op,
          HashAggregateGroupingData *data,ExecutionContext *context)

{
  _Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_> _Var1;
  pointer puVar2;
  size_type __n;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var3;
  _Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_> _Var4;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var5;
  type pDVar6;
  pointer pDVar7;
  pointer pDVar8;
  mapped_type *pmVar9;
  reference this_00;
  pointer context_00;
  reference pvVar10;
  unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
  *this_01;
  pointer *__ptr;
  pointer __k;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> local_48;
  vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
  *local_40;
  HashAggregateGroupingLocalState *local_38;
  
  local_40 = &this->distinct_states;
  (this->distinct_states).
  super_vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->distinct_states).
  super_vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false> =
       (_Head_base<0UL,_duckdb::LocalSinkState_*,_false>)0x0;
  (this->distinct_states).
  super_vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38 = this;
  RadixPartitionedHashTable::GetLocalSinkState
            ((RadixPartitionedHashTable *)&stack0xffffffffffffffb8,(ExecutionContext *)data);
  _Var4.super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LocalSinkState_*,_false>)
       (_Head_base<0UL,_duckdb::LocalSinkState_*,_false>)local_48._M_head_impl;
  local_48._M_head_impl = (LocalSinkState *)0x0;
  _Var1.super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl =
       (this->table_state).
       super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
       super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
       .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>;
  (this->table_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false> =
       _Var4.super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl !=
      (LocalSinkState *)0x0) {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl
                + 8))();
    if (local_48._M_head_impl != (LocalSinkState *)0x0) {
      (*(local_48._M_head_impl)->_vptr_LocalSinkState[1])();
    }
  }
  if ((data->distinct_data).
      super_unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateData_*,_std::default_delete<duckdb::DistinctAggregateData>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateData_*,_false>._M_head_impl !=
      (DistinctAggregateData *)0x0) {
    pDVar6 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
             ::operator*(&data->distinct_data);
    this_01 = &op->distinct_collection_info;
    pDVar7 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
             ::operator->(this_01);
    pDVar8 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
             ::operator->(this_01);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
    ::resize(&local_40->
              super_vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
             ,(long)(pDVar8->aggregates->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pDVar8->aggregates->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    pDVar8 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
             ::operator->(this_01);
    puVar2 = (pDVar7->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = (pDVar7->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start; __k != puVar2; __k = __k + 1) {
      pmVar9 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pDVar8->table_map,__k);
      __n = *pmVar9;
      this_00 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                ::get<true>(&pDVar6->radix_tables,__n);
      if ((this_00->
          super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
          (RadixPartitionedHashTable *)0x0) {
        context_00 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                     ::operator->(this_00);
        RadixPartitionedHashTable::GetLocalSinkState
                  ((RadixPartitionedHashTable *)&stack0xffffffffffffffb8,
                   (ExecutionContext *)context_00);
        pvVar10 = vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
                  ::get<true>(local_40,__n);
        _Var5._M_head_impl = local_48._M_head_impl;
        local_48._M_head_impl = (LocalSinkState *)0x0;
        _Var3._M_head_impl =
             (pvVar10->
             super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
             ._M_t.
             super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
             .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
        (pvVar10->
        super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)._M_t
        .super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
        .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = _Var5._M_head_impl;
        if (_Var3._M_head_impl != (LocalSinkState *)0x0) {
          (**(code **)((long)(_Var3._M_head_impl)->_vptr_LocalSinkState + 8))();
        }
        if (local_48._M_head_impl != (LocalSinkState *)0x0) {
          (*(local_48._M_head_impl)->_vptr_LocalSinkState[1])();
        }
      }
    }
  }
  return;
}

Assistant:

HashAggregateGroupingLocalState::HashAggregateGroupingLocalState(const PhysicalHashAggregate &op,
                                                                 const HashAggregateGroupingData &data,
                                                                 ExecutionContext &context) {
	table_state = data.table_data.GetLocalSinkState(context);
	if (!data.HasDistinct()) {
		return;
	}
	auto &distinct_data = *data.distinct_data;

	auto &distinct_indices = op.distinct_collection_info->Indices();
	D_ASSERT(!distinct_indices.empty());

	distinct_states.resize(op.distinct_collection_info->aggregates.size());
	auto &table_map = op.distinct_collection_info->table_map;

	for (auto &idx : distinct_indices) {
		idx_t table_idx = table_map[idx];
		auto &radix_table = distinct_data.radix_tables[table_idx];
		if (radix_table == nullptr) {
			// This aggregate has identical input as another aggregate, so no table is created for it
			continue;
		}
		// Initialize the states of the radix tables used for the distinct aggregates
		distinct_states[table_idx] = radix_table->GetLocalSinkState(context);
	}
}